

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockOffsetContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  SharedPtrStateBase *pSVar1;
  NodeType NVar2;
  NodeType NVar3;
  Node *pNVar4;
  TestNode *pTVar5;
  TestContext *pTVar6;
  LayoutQualifier *this;
  ArrayElement *pAVar7;
  Variable *pVVar8;
  ResourceTestCase *pRVar9;
  bool bVar10;
  undefined1 local_128 [8];
  SharedPtr elementVariable_2;
  SharedPtr memberVariable_1;
  SharedPtr arrayElement_2;
  SharedPtr structMember_1;
  TestCaseGroup *blockGroup_3;
  TestCaseGroup *blockGroup_2;
  SharedPtr elementVariable_1;
  SharedPtr memberVariable;
  SharedPtr arrayElement_1;
  SharedPtr structMember;
  SharedPtr elementVariable;
  SharedPtr arrayElement;
  undefined1 local_60 [8];
  SharedPtr offset;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  bool namedNonArrayBlock;
  bool isInterfaceBlock;
  ProgramResourceQueryTestTarget queryTarget;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  queryTarget = (ProgramResourceQueryTestTarget)targetGroup;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,PROGRAMINTERFACE_UNIFORM,
             0x200);
  pNVar4 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar2 = ResourceDefinition::Node::getType(pNVar4);
  bVar10 = false;
  if (NVar2 == TYPE_INTERFACE_BLOCK) {
    pNVar4 = de::
             SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             ::get(parentStructure);
    bVar10 = false;
    if (((ulong)pNVar4[1]._vptr_Node & 1) != 0) {
      pNVar4 = de::
               SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               ::operator->(parentStructure);
      pNVar4 = ResourceDefinition::Node::getEnclosingNode(pNVar4);
      NVar3 = ResourceDefinition::Node::getType(pNVar4);
      bVar10 = NVar3 != TYPE_ARRAY_ELEMENT;
    }
  }
  if (NVar2 == TYPE_INTERFACE_BLOCK) {
    if (bVar10) {
      pTVar5 = (TestNode *)operator_new(0x70);
      pTVar6 = gles31::Context::getTestContext(context);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,pTVar6,"types","Types");
      tcu::TestNode::addChild((TestNode *)queryTarget,pTVar5);
      generateVariableCases
                (context,parentStructure,(TestCaseGroup *)pTVar5,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,3,false);
      generateOpaqueTypeCases
                (context,parentStructure,(TestCaseGroup *)pTVar5,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,3,false);
      pTVar5 = (TestNode *)operator_new(0x70);
      pTVar6 = gles31::Context::getTestContext(context);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,pTVar6,"aggregates","Aggregate types");
      tcu::TestNode::addChild((TestNode *)queryTarget,pTVar5);
      pNVar4 = (Node *)operator_new(0x20);
      ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&arrayElement_2.m_state,pNVar4);
      pNVar4 = (Node *)operator_new(0x20);
      ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&memberVariable_1.m_state,pNVar4);
      pVVar8 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar8,(SharedPtr *)&arrayElement_2.m_state,TYPE_FLOAT)
      ;
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&elementVariable_2.m_state,(Node *)pVVar8);
      pVVar8 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable
                (pVVar8,(SharedPtr *)&memberVariable_1.m_state,TYPE_FLOAT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_128,(Node *)pVVar8);
      pRVar9 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar9,context,(SharedPtr *)&elementVariable_2.m_state,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"float_struct");
      tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar9);
      pRVar9 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar9,context,(SharedPtr *)local_128,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"float_array");
      tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar9);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)local_128);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&elementVariable_2.m_state);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&memberVariable_1.m_state);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&arrayElement_2.m_state);
    }
    else {
      generateVariableCases
                (context,parentStructure,(TestCaseGroup *)queryTarget,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1,true);
      generateVariableArrayCases
                (context,parentStructure,(TestCaseGroup *)queryTarget,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1);
      generateCompoundVariableCases
                (context,parentStructure,(TestCaseGroup *)queryTarget,
                 (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1);
    }
  }
  else {
    pTVar5 = (TestNode *)operator_new(0x70);
    pTVar6 = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,pTVar6,"types","Types");
    tcu::TestNode::addChild((TestNode *)queryTarget,pTVar5);
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)pTVar5,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,3,false);
    generateOpaqueTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar5,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,3,false);
    pTVar5 = (TestNode *)operator_new(0x70);
    pTVar6 = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,pTVar6,"aggregates","Aggregate types")
    ;
    offset.m_state = (SharedPtrStateBase *)pTVar5;
    tcu::TestNode::addChild((TestNode *)queryTarget,pTVar5);
    this = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&arrayElement.m_state + 4),-1,-1,4,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (this,parentStructure,(Layout *)((long)&arrayElement.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_60,(Node *)this);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_60,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&elementVariable.m_state,(Node *)pAVar7);
    pVVar8 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar8,(SharedPtr *)&elementVariable.m_state,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&structMember.m_state,(Node *)pVVar8);
    pSVar1 = offset.m_state;
    pRVar9 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar9,context,(SharedPtr *)&structMember.m_state,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"atomic_uint_array");
    tcu::TestNode::addChild((TestNode *)pSVar1,(TestNode *)pRVar9);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&structMember.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&elementVariable.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_60);
    pNVar4 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement_1.m_state,pNVar4);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&memberVariable.m_state,(Node *)pAVar7);
    pVVar8 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar8,(SharedPtr *)&arrayElement_1.m_state,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&elementVariable_1.m_state,(Node *)pVVar8);
    pVVar8 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar8,(SharedPtr *)&memberVariable.m_state,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_2,(Node *)pVVar8);
    pSVar1 = offset.m_state;
    pRVar9 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar9,context,(SharedPtr *)&elementVariable_1.m_state,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"float_struct");
    tcu::TestNode::addChild((TestNode *)pSVar1,(TestNode *)pRVar9);
    pSVar1 = offset.m_state;
    pRVar9 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar9,context,(SharedPtr *)&blockGroup_2,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"float_array");
    tcu::TestNode::addChild((TestNode *)pSVar1,(TestNode *)pRVar9);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&elementVariable_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&memberVariable.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement_1.m_state);
  }
  return;
}

Assistant:

static void generateUniformBlockOffsetContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_OFFSET);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .atomic_uint_struct
			// .atomic_uint_array
			{
				const ResourceDefinition::Node::SharedPtr offset			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, 4)));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(offset));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "atomic_uint_array"));
			}

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else if (namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}